

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_stats.cpp
# Opt level: O2

void duckdb::ArrayStats::Verify
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  sel_t *psVar1;
  BaseStatistics *this;
  Vector *vector_00;
  idx_t iVar2;
  long lVar3;
  idx_t iVar4;
  idx_t iVar5;
  ulong uVar6;
  idx_t iVar7;
  bool bVar8;
  SelectionVector element_sel;
  UnifiedVectorFormat vdata;
  
  this = GetChildStats(stats);
  vector_00 = ArrayVector::GetEntry(vector);
  iVar2 = ArrayType::GetSize(&vector->type);
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  Vector::ToUnifiedFormat(vector,count,&vdata);
  lVar3 = 0;
  for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
    iVar5 = iVar4;
    if (sel->sel_vector != (sel_t *)0x0) {
      iVar5 = (idx_t)sel->sel_vector[iVar4];
    }
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      iVar5 = (idx_t)(vdata.sel)->sel_vector[iVar5];
    }
    uVar6 = 1;
    if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      uVar6 = (ulong)((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                       [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0);
    }
    lVar3 = lVar3 + uVar6;
  }
  SelectionVector::SelectionVector(&element_sel,lVar3 * iVar2);
  psVar1 = sel->sel_vector;
  iVar4 = 0;
  for (iVar5 = 0; iVar5 != count; iVar5 = iVar5 + 1) {
    iVar7 = iVar5;
    if (psVar1 != (sel_t *)0x0) {
      iVar7 = (idx_t)psVar1[iVar5];
    }
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      iVar7 = (idx_t)(vdata.sel)->sel_vector[iVar7];
    }
    if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar7 >> 6] >>
         (iVar7 & 0x3f) & 1) != 0)) {
      uVar6 = iVar7 * iVar2;
      iVar7 = iVar2;
      while (bVar8 = iVar7 != 0, iVar7 = iVar7 - 1, bVar8) {
        element_sel.sel_vector[iVar4] = (sel_t)uVar6;
        iVar4 = iVar4 + 1;
        uVar6 = (ulong)((sel_t)uVar6 + 1);
      }
    }
  }
  BaseStatistics::Verify(this,vector_00,&element_sel,iVar4);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&element_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
  return;
}

Assistant:

void ArrayStats::Verify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel, idx_t count) {
	auto &child_stats = ArrayStats::GetChildStats(stats);
	auto &child_entry = ArrayVector::GetEntry(vector);
	auto array_size = ArrayType::GetSize(vector.GetType());

	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	// Basically,
	// 1. Count the number of valid arrays
	// 2. Create a selection vector with the size of the number of valid arrays * array_size
	// 3. Fill the selection vector with the offsets of all the elements in the child vector
	//      that exist in each valid array
	// 4. Use that selection vector to verify the child stats

	idx_t valid_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (vdata.validity.RowIsValid(index)) {
			valid_count++;
		}
	}

	SelectionVector element_sel(valid_count * array_size);
	idx_t element_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		auto offset = index * array_size;
		if (vdata.validity.RowIsValid(index)) {
			for (idx_t elem_idx = 0; elem_idx < array_size; elem_idx++) {
				element_sel.set_index(element_count++, offset + elem_idx);
			}
		}
	}

	child_stats.Verify(child_entry, element_sel, element_count);
}